

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O3

bool Diligent::VerifyStateTransitionDesc
               (IRenderDevice *pDevice,StateTransitionDesc *Barrier,
               DeviceContextIndex ExecutionCtxId,DeviceContextDesc *CtxDesc)

{
  Uint32 *Args_1;
  Uint32 *Args_1_00;
  byte bVar1;
  RESOURCE_STATE RVar2;
  RESOURCE_DIMENSION RVar3;
  RESOURCE_DIMENSION RVar4;
  bool bVar5;
  STATE_TRANSITION_TYPE SVar6;
  int iVar7;
  RESOURCE_STATE RVar8;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*Args_1_01) [41];
  char (*pacVar11) [39];
  undefined4 extraout_var_03;
  undefined4 uVar12;
  uint uVar13;
  Uint32 UVar14;
  DeviceContextDesc *Args_1_02;
  undefined7 uVar16;
  char (*Args_1_03) [132];
  ulong uVar15;
  char (*Args_1_04) [75];
  char *pcVar17;
  IDeviceObject *pIVar18;
  RefCntAutoPtr<Diligent::IBuffer> *in_R9;
  undefined1 auVar19 [16];
  char (*Args_7) [15];
  char (*in_stack_ffffffffffffff68) [3];
  string msg;
  RefCntAutoPtr<Diligent::IBuffer> pBuffer;
  RefCntAutoPtr<Diligent::ITopLevelAS> pTopLevelAS;
  RefCntAutoPtr<Diligent::IBottomLevelAS> pBottomLevelAS;
  Uint64 ImmediateContextMask;
  RefCntAutoPtr<Diligent::ITexture> pTexture;
  RefCntAutoPtr<Diligent::IBuffer> *Args_3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if ((Barrier->Flags & STATE_TRANSITION_FLAG_ALIASING) != STATE_TRANSITION_FLAG_NONE) {
    pcVar17 = (char *)Barrier;
    if ((Barrier->Flags & ~STATE_TRANSITION_FLAG_ALIASING) != STATE_TRANSITION_FLAG_NONE) {
      FormatString<char[42],char[71]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])
                 "STATE_TRANSITION_FLAG_ALIASING flag is not compatible with other flags",
                 (char (*) [71])CtxDesc);
      pcVar17 = "VerifyStateTransitionDesc";
      CtxDesc = (DeviceContextDesc *)0x1e4;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1e4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        pcVar17 = (char *)(msg.field_2._M_allocated_capacity + 1);
        operator_delete(msg._M_dataplus._M_p,(ulong)pcVar17);
      }
      if ((Barrier->Flags & STATE_TRANSITION_FLAG_ALIASING) == STATE_TRANSITION_FLAG_NONE) {
        FormatString<char[26],char[47]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Barrier.Flags & STATE_TRANSITION_FLAG_ALIASING",
                   (char (*) [47])CtxDesc);
        pcVar17 = "VerifyAliasingBarrierDesc";
        CtxDesc = (DeviceContextDesc *)0x1a6;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyAliasingBarrierDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x1a6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          pcVar17 = (char *)(msg.field_2._M_allocated_capacity + 1);
          operator_delete(msg._M_dataplus._M_p,(ulong)pcVar17);
        }
      }
    }
    RVar3 = VerifyAliasingBarrierDesc::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)Barrier->pResourceBefore,(IDeviceObject *)pcVar17)
    ;
    RVar4 = VerifyAliasingBarrierDesc::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)Barrier->pResource,(IDeviceObject *)pcVar17);
    uVar16 = (undefined7)((ulong)CtxDesc >> 8);
    Args_1_03 = (char (*) [132])CONCAT71(uVar16,RVar3 == RESOURCE_DIM_UNDEFINED);
    if ((RVar4 != RESOURCE_DIM_UNDEFINED && RVar3 != RESOURCE_DIM_UNDEFINED) &&
       (Args_1_03 = (char (*) [132])CONCAT71(uVar16,RVar3 == RESOURCE_DIM_BUFFER),
       (RVar4 != RESOURCE_DIM_BUFFER) == (RVar3 == RESOURCE_DIM_BUFFER))) {
      FormatString<char[42],char[130]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])
                 "Both before- and after-resources must either be buffers or textures. Sparse aliasing between textures and buffers is not allowed."
                 ,(char (*) [130])Args_1_03);
      Args_1_03 = (char (*) [132])0x1cf;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyAliasingBarrierDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1cf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    RVar8 = Barrier->NewState | Barrier->OldState;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)RVar8;
    if (RVar8 != RESOURCE_STATE_UNKNOWN) {
      FormatString<char[42],char[111]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])
                 "Aliasing barrier does not support state transitions. OldState and NewState must both be RESOURCE_STATE_UNKNOWN"
                 ,(char (*) [111])Args_1_03);
      Args_1_03 = (char (*) [132])0x1d3;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyAliasingBarrierDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1d3);
      paVar10 = &msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != paVar10) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        paVar10 = extraout_RAX;
      }
    }
    auVar19._0_4_ = -(uint)(Barrier->FirstMipLevel == 0);
    auVar19._4_4_ = -(uint)(Barrier->MipLevelsCount == 0xffffffff);
    auVar19._8_4_ = -(uint)(Barrier->FirstArraySlice == 0);
    auVar19._12_4_ = -(uint)(Barrier->ArraySliceCount == 0xffffffff);
    iVar7 = movmskps((int)paVar10,auVar19);
    if (iVar7 == 0xf) {
      return true;
    }
    FormatString<char[42],char[132]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])
               "Aliasing barrier is applied to all subresources. FirstMipLevel, MipLevelsCount, FirstArraySlice and ArraySliceCount must be default"
               ,Args_1_03);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyAliasingBarrierDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1d7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p == &msg.field_2) {
      return true;
    }
    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    return true;
  }
  Args_1_02 = CtxDesc;
  if (Barrier->pResourceBefore != (IDeviceObject *)0x0) {
    FormatString<char[42],char[77]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])
               "pResourceBefore is only used for aliasing barrier and must be null otherwise",
               (char (*) [77])CtxDesc);
    Args_1_02 = (DeviceContextDesc *)0x1e8;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (Barrier->NewState < RESOURCE_STATE_VERTEX_BUFFER) {
    FormatString<char[42],char[42]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])"NewState must not be UNKNOWN or UNDEFINED",(char (*) [42])Args_1_02);
    Args_1_02 = (DeviceContextDesc *)0x1ea;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1ea);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pIVar18 = Barrier->pResource;
  if (pIVar18 == (IDeviceObject *)0x0) {
    FormatString<char[42],char[28]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])"pResource must not be null.",(char (*) [28])Args_1_02);
    Args_1_02 = (DeviceContextDesc *)0x1ed;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1ed);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    pIVar18 = Barrier->pResource;
    ImmediateContextMask = 0;
    pTexture.m_pObject = (ITexture *)0x0;
    if (pIVar18 != (IDeviceObject *)0x0) goto LAB_00474838;
LAB_00474f25:
    pBuffer.m_pObject = (IBuffer *)0x0;
    pBottomLevelAS.m_pObject = (IBottomLevelAS *)0x0;
    pTopLevelAS.m_pObject = (ITopLevelAS *)0x0;
LAB_00474f31:
    FormatString<char[26]>(&msg,(char (*) [26])"unsupported resource type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x236);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    RVar8 = RESOURCE_STATE_UNKNOWN;
LAB_00474f7d:
    if (pTopLevelAS.m_pObject != (ITopLevelAS *)0x0) {
      (*((pTopLevelAS.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[2])();
    }
LAB_00474f8d:
    if (pBottomLevelAS.m_pObject != (IBottomLevelAS *)0x0) {
      (*((pBottomLevelAS.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[2])();
    }
LAB_00474f9d:
    if (pBuffer.m_pObject != (IBuffer *)0x0) {
      (*((pBuffer.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[2])();
    }
  }
  else {
LAB_00474838:
    pTexture.m_pObject = (ITexture *)0x0;
    ImmediateContextMask = 0;
    (**(pIVar18->super_IObject)._vptr_IObject)(pIVar18,IID_Texture,&pTexture);
    if (pTexture.m_pObject == (ITexture *)0x0) {
      pIVar18 = Barrier->pResource;
      pBuffer.m_pObject = (IBuffer *)0x0;
      if (pIVar18 == (IDeviceObject *)0x0) goto LAB_00474f25;
      (**(pIVar18->super_IObject)._vptr_IObject)(pIVar18,IID_Buffer,&pBuffer);
      if (pBuffer.m_pObject == (IBuffer *)0x0) {
        pIVar18 = Barrier->pResource;
        pBottomLevelAS.m_pObject = (IBottomLevelAS *)0x0;
        if (pIVar18 == (IDeviceObject *)0x0) {
          pTopLevelAS.m_pObject = (ITopLevelAS *)0x0;
          goto LAB_00474f31;
        }
        (**(pIVar18->super_IObject)._vptr_IObject)(pIVar18,IID_BottomLevelAS,&pBottomLevelAS);
        if (pBottomLevelAS.m_pObject == (IBottomLevelAS *)0x0) {
          pIVar18 = Barrier->pResource;
          pTopLevelAS.m_pObject = (ITopLevelAS *)0x0;
          if ((pIVar18 == (IDeviceObject *)0x0) ||
             ((**(pIVar18->super_IObject)._vptr_IObject)(pIVar18,IID_TopLevelAS,&pTopLevelAS),
             pTopLevelAS.m_pObject == (ITopLevelAS *)0x0)) goto LAB_00474f31;
          iVar7 = (*((pTopLevelAS.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[4])()
          ;
          pacVar11 = (char (*) [39])CONCAT44(extraout_var_03,iVar7);
          ImmediateContextMask = *(Uint64 *)(*pacVar11 + 0x18);
          RVar8 = Barrier->OldState;
          if ((RVar8 == RESOURCE_STATE_UNKNOWN) &&
             (RVar8 = (*((pTopLevelAS.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject
                        [0xd])(), RVar8 == RESOURCE_STATE_UNKNOWN)) {
            FormatString<char[42],char[20],char_const*,char[75]>
                      (&msg,(Diligent *)"State transition parameters are invalid: ",
                       (char (*) [42])0x6a73b1,(char (*) [20])pacVar11,
                       (char **)
                       "\' is unknown to the engine and is not explicitly specified in the barrier."
                       ,(char (*) [75])in_R9);
            Args_1_02 = (DeviceContextDesc *)0x22f;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x22f);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            RVar8 = RESOURCE_STATE_UNKNOWN;
          }
          RVar2 = Barrier->NewState;
          if (((RVar2 != RESOURCE_STATE_BUILD_AS_READ) && (RVar2 != RESOURCE_STATE_BUILD_AS_WRITE))
             && (RVar2 != RESOURCE_STATE_RAY_TRACING)) {
            FormatString<char[42],char[39],char_const*,char[3]>
                      (&msg,(Diligent *)"State transition parameters are invalid: ",
                       (char (*) [42])"invalid new state specified for TLAS \'",pacVar11,
                       (char **)"\'.",(char (*) [3])in_R9);
            Args_1_02 = (DeviceContextDesc *)0x231;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x231);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if (Barrier->TransitionType != STATE_TRANSITION_TYPE_IMMEDIATE) {
            FormatString<char[42],char[43]>
                      (&msg,(Diligent *)"State transition parameters are invalid: ",
                       (char (*) [42])"split barriers are not supported for TLAS.",
                       (char (*) [43])Args_1_02);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x232);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          goto LAB_00474f7d;
        }
        iVar7 = (*((pBottomLevelAS.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[4])
                          ();
        pacVar11 = (char (*) [39])CONCAT44(extraout_var_02,iVar7);
        ImmediateContextMask = *(Uint64 *)(pacVar11[1] + 9);
        RVar8 = Barrier->OldState;
        if ((RVar8 == RESOURCE_STATE_UNKNOWN) &&
           (RVar8 = (*((pBottomLevelAS.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject
                      [0xe])(), RVar8 == RESOURCE_STATE_UNKNOWN)) {
          FormatString<char[42],char[20],char_const*,char[75]>
                    (&msg,(Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])0x6a7330,(char (*) [20])pacVar11,
                     (char **)
                     "\' is unknown to the engine and is not explicitly specified in the barrier.",
                     (char (*) [75])in_R9);
          Args_1_02 = (DeviceContextDesc *)0x225;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x225);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
          RVar8 = RESOURCE_STATE_UNKNOWN;
        }
        if ((Barrier->NewState != RESOURCE_STATE_BUILD_AS_READ) &&
           (Barrier->NewState != RESOURCE_STATE_BUILD_AS_WRITE)) {
          FormatString<char[42],char[39],char_const*,char[3]>
                    (&msg,(Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])"invalid new state specified for BLAS \'",pacVar11,
                     (char **)"\'.",(char (*) [3])in_R9);
          Args_1_02 = (DeviceContextDesc *)0x227;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x227);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        if (Barrier->TransitionType != STATE_TRANSITION_TYPE_IMMEDIATE) {
          FormatString<char[42],char[43]>
                    (&msg,(Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])"split barriers are not supported for BLAS.",
                     (char (*) [43])Args_1_02);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_00474f8d;
      }
      iVar7 = (*((pBuffer.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      Args_1_01 = (char (*) [41])CONCAT44(extraout_var_01,iVar7);
      ImmediateContextMask = *(Uint64 *)(*Args_1_01 + 0x20);
      bVar5 = VerifyResourceStates(Barrier->NewState,false);
      if (!bVar5) {
        FormatString<char[42],char[41],char_const*,char[3]>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"invalid new state specified for buffer \'",Args_1_01,
                   (char **)"\'.",(char (*) [3])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x21b);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      RVar8 = Barrier->OldState;
      if ((RVar8 == RESOURCE_STATE_UNKNOWN) &&
         (RVar8 = (*((pBuffer.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[0xc])(),
         RVar8 == RESOURCE_STATE_UNKNOWN)) {
        FormatString<char[42],char[22],char_const*,char[75]>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])0x6a725e,(char (*) [22])Args_1_01,
                   (char **)
                   "\' is unknown to the engine and is not explicitly specified in the barrier.",
                   (char (*) [75])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x21d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
        RVar8 = RESOURCE_STATE_UNKNOWN;
      }
      bVar5 = VerifyResourceStates(RVar8,false);
      if (!bVar5) {
        FormatString<char[42],char[41],char_const*,char[3]>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"invalid old state specified for buffer \'",Args_1_01,
                   (char **)"\'.",(char (*) [3])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x21e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_00474f9d;
    }
    iVar7 = (*((pTexture.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    Args_3 = (RefCntAutoPtr<Diligent::IBuffer> *)CONCAT44(extraout_var,iVar7);
    ImmediateContextMask = *(Uint64 *)(Args_3 + 9);
    bVar5 = VerifyResourceStates(Barrier->NewState,true);
    if (!bVar5) {
      FormatString<char[42],char[42],char_const*,char[3]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"invalid new state specified for texture \'",(char (*) [42])Args_3,
                 (char **)"\'.",(char (*) [3])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1f7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    RVar8 = Barrier->OldState;
    if ((RVar8 == RESOURCE_STATE_UNKNOWN) &&
       (RVar8 = (*((pTexture.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[0xc])(),
       RVar8 == RESOURCE_STATE_UNKNOWN)) {
      FormatString<char[42],char[23],char_const*,char[75]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])0x6a7105,(char (*) [23])Args_3,
                 (char **)
                 "\' is unknown to the engine and is not explicitly specified in the barrier.",
                 (char (*) [75])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1fb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      RVar8 = RESOURCE_STATE_UNKNOWN;
    }
    Args_7 = (char (*) [15])0x474961;
    bVar5 = VerifyResourceStates(RVar8,true);
    if (!bVar5) {
      FormatString<char[42],char[42],char_const*,char[3]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"invalid old state specified for texture \'",(char (*) [42])Args_3,
                 (char **)"\'.",(char (*) [3])in_R9);
      Args_7 = (char (*) [15])0x4749a4;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1fc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        Args_7 = (char (*) [15])0x4749bf;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    Args_1 = &Barrier->FirstMipLevel;
    pcVar17 = (char *)((long)(Args_3 + 3) + 4);
    if (*(uint *)((long)(Args_3 + 3) + 4) <= Barrier->FirstMipLevel) {
      in_R9 = Args_3;
      FormatString<char[42],char[18],unsigned_int,char[54],char_const*,char[12],unsigned_int,char[15]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"first mip level (",(char (*) [18])Args_1,
                 (uint *)") specified by the barrier is out of range. Texture \'",
                 (char (*) [54])Args_3,(char **)"\' has only ",(char (*) [12])pcVar17,
                 (uint *)" mip level(s).",Args_7);
      Args_7 = (char (*) [15])0x474a2c;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        Args_7 = (char (*) [15])0x474a47;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if ((Barrier->MipLevelsCount != 0xffffffff) &&
       (uVar9 = Barrier->MipLevelsCount + *Args_1, *(uint *)pcVar17 < uVar9)) {
      in_R9 = &pBuffer;
      pBuffer.m_pObject._0_4_ = uVar9 - 1;
      FormatString<char[42],char[17],unsigned_int,char[3],unsigned_int,char[53],char_const*,char[12],unsigned_int,char[15]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"mip level range ",(char (*) [17])Args_1,(uint *)"..",
                 (char (*) [3])in_R9,(uint *)0x752bd4,(char (*) [53])Args_3,(char **)"\' has only ",
                 (char (*) [12])pcVar17,(uint *)" mip level(s).",Args_7);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x204);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    bVar1 = *(byte *)(Args_3 + 1);
    uVar9 = 1;
    if ((bVar1 < 9) && ((0x1a8U >> (bVar1 & 0x1f) & 1) != 0)) {
      uVar9 = *(uint *)((long)(Args_3 + 2) + 4);
    }
    Args_1_00 = &Barrier->FirstArraySlice;
    if (uVar9 <= Barrier->FirstArraySlice) {
      uVar12 = 1;
      if ((bVar1 < 9) && ((0x1a8U >> (bVar1 & 0x1f) & 1) != 0)) {
        uVar12 = *(undefined4 *)((long)(Args_3 + 2) + 4);
      }
      pBuffer.m_pObject._0_4_ = uVar12;
      in_R9 = Args_3;
      FormatString<char[42],char[20],unsigned_int,char[68],char_const*,char[6],unsigned_int>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"first array slice (",(char (*) [20])Args_1_00,
                 (uint *)") specified by the barrier is out of range. Array size of texture \'",
                 (char (*) [68])Args_3,(char **)"\' is ",(char (*) [6])&pBuffer,
                 (uint *)in_stack_ffffffffffffff68);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if (Barrier->ArraySliceCount != 0xffffffff) {
      bVar1 = *(byte *)(Args_3 + 1);
      uVar9 = 1;
      if ((bVar1 < 9) && ((0x1a8U >> (bVar1 & 0x1f) & 1) != 0)) {
        uVar9 = *(uint *)((long)(Args_3 + 2) + 4);
      }
      uVar13 = *Args_1_00 + Barrier->ArraySliceCount;
      if (uVar9 < uVar13) {
        pBuffer.m_pObject._0_4_ = uVar13 - 1;
        uVar12 = 1;
        if ((bVar1 < 9) && ((0x1a8U >> (bVar1 & 0x1f) & 1) != 0)) {
          uVar12 = *(undefined4 *)((long)(Args_3 + 2) + 4);
        }
        pBottomLevelAS.m_pObject._0_4_ = uVar12;
        in_R9 = &pBuffer;
        FormatString<char[42],char[19],unsigned_int,char[3],unsigned_int,char[67],char_const*,char[6],unsigned_int>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"array slice range ",(char (*) [19])Args_1_00,(uint *)"..",
                   (char (*) [3])in_R9,(uint *)0x752c4d,(char (*) [67])Args_3,(char **)"\' is ",
                   (char (*) [6])&pBottomLevelAS,(uint *)in_stack_ffffffffffffff68);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x20c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
    }
    iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
    if ((*(int *)CONCAT44(extraout_var_00,iVar7) != 2) &&
       (*(int *)CONCAT44(extraout_var_00,iVar7) != 5)) {
      if ((*Args_1 != 0) ||
         ((Barrier->MipLevelsCount != 0xffffffff && (Barrier->MipLevelsCount != *(Uint32 *)pcVar17))
         )) {
        FormatString<char[42],char[31],char_const*,char[60]>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"failed to transition texture \'",(char (*) [31])Args_3,
                   (char **)"\': only whole resources can be transitioned on this device.",
                   (char (*) [60])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x212);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*Args_1_00 == 0) {
        if (Barrier->ArraySliceCount != 0xffffffff) {
          UVar14 = 1;
          if ((*(byte *)(Args_3 + 1) < 9) && ((0x1a8U >> (*(byte *)(Args_3 + 1) & 0x1f) & 1) != 0))
          {
            UVar14 = *(Uint32 *)((long)(Args_3 + 2) + 4);
          }
          if (Barrier->ArraySliceCount != UVar14) goto LAB_00474eb9;
        }
      }
      else {
LAB_00474eb9:
        FormatString<char[42],char[31],char_const*,char[60]>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"failed to transition texture \'",(char (*) [31])Args_3,
                   (char **)"\': only whole resources can be transitioned on this device.",
                   (char (*) [60])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x214);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if (pTexture.m_pObject != (ITexture *)0x0) {
    (*((pTexture.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[2])();
  }
  uVar15 = (ulong)ExecutionCtxId.m_Value;
  if ((ImmediateContextMask >> (uVar15 & 0x3f) & 1) == 0) {
    FormatString<char[42],char[50],std::ios_base&(std::ios_base&),unsigned_long,char[41],char_const*,char[3]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])"resource was created with ImmediateContextMask 0x",
               (char (*) [50])std::hex,(_func_ios_base_ptr_ios_base_ptr *)&ImmediateContextMask,
               (unsigned_long *)" and can not be used in device context \'",(char (*) [41])CtxDesc,
               (char **)"\'.",in_stack_ffffffffffffff68);
    uVar15 = 0x23a;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x23a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  bVar5 = Barrier->NewState != RESOURCE_STATE_UNORDERED_ACCESS;
  Args_1_04 = (char (*) [75])
              CONCAT71((int7)(uVar15 >> 8),bVar5 || RVar8 != RESOURCE_STATE_UNORDERED_ACCESS);
  SVar6 = Barrier->TransitionType;
  if (SVar6 != STATE_TRANSITION_TYPE_IMMEDIATE &&
      (!bVar5 && RVar8 == RESOURCE_STATE_UNORDERED_ACCESS)) {
    FormatString<char[42],char[75]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])
               "for UAV barriers, transition type must be STATE_TRANSITION_TYPE_IMMEDIATE.",
               Args_1_04);
    Args_1_04 = (char (*) [75])0x23f;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x23f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    SVar6 = Barrier->TransitionType;
  }
  if ((SVar6 != STATE_TRANSITION_TYPE_IMMEDIATE) && (SVar6 != STATE_TRANSITION_TYPE_END)) {
    if (SVar6 == STATE_TRANSITION_TYPE_BEGIN) {
      if ((Barrier->Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) == STATE_TRANSITION_FLAG_NONE)
      goto LAB_00475153;
      FormatString<char[42],char[56]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"resource state can\'t be updated in begin-split barrier.",
                 (char (*) [56])Args_1_04);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x248);
    }
    else {
      FormatString<char[27]>(&msg,(char (*) [27])"Unexpected transition type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x24f);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00475153:
  VerifyResourceState(Barrier->OldState,CtxDesc->QueueType,"OldState");
  VerifyResourceState(Barrier->NewState,CtxDesc->QueueType,"NewState");
  return true;
}

Assistant:

bool VerifyStateTransitionDesc(const IRenderDevice*       pDevice,
                               const StateTransitionDesc& Barrier,
                               DeviceContextIndex         ExecutionCtxId,
                               const DeviceContextDesc&   CtxDesc)
{
    if (Barrier.Flags & STATE_TRANSITION_FLAG_ALIASING)
    {
        CHECK_STATE_TRANSITION_DESC((Barrier.Flags & ~STATE_TRANSITION_FLAG_ALIASING) == 0,
                                    "STATE_TRANSITION_FLAG_ALIASING flag is not compatible with other flags");
        return VerifyAliasingBarrierDesc(Barrier);
    }

    CHECK_STATE_TRANSITION_DESC(Barrier.pResourceBefore == nullptr, "pResourceBefore is only used for aliasing barrier and must be null otherwise");
    CHECK_STATE_TRANSITION_DESC(Barrier.NewState != RESOURCE_STATE_UNKNOWN && Barrier.NewState != RESOURCE_STATE_UNDEFINED,
                                "NewState must not be UNKNOWN or UNDEFINED");


    CHECK_STATE_TRANSITION_DESC(Barrier.pResource != nullptr, "pResource must not be null.");

    RESOURCE_STATE OldState             = RESOURCE_STATE_UNKNOWN;
    Uint64         ImmediateContextMask = 0;

    if (RefCntAutoPtr<ITexture> pTexture{Barrier.pResource, IID_Texture})
    {
        const TextureDesc& TexDesc = pTexture->GetDesc();
        ImmediateContextMask       = TexDesc.ImmediateContextMask;

        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(Barrier.NewState, true), "invalid new state specified for texture '", TexDesc.Name, "'.");
        OldState = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pTexture->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN,
                                    "the state of texture '", TexDesc.Name,
                                    "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(OldState, true), "invalid old state specified for texture '", TexDesc.Name, "'.");

        CHECK_STATE_TRANSITION_DESC(Barrier.FirstMipLevel < TexDesc.MipLevels, "first mip level (", Barrier.FirstMipLevel,
                                    ") specified by the barrier is out of range. Texture '",
                                    TexDesc.Name, "' has only ", TexDesc.MipLevels, " mip level(s).");
        CHECK_STATE_TRANSITION_DESC(Barrier.MipLevelsCount == REMAINING_MIP_LEVELS || Barrier.FirstMipLevel + Barrier.MipLevelsCount <= TexDesc.MipLevels,
                                    "mip level range ", Barrier.FirstMipLevel, "..", Barrier.FirstMipLevel + Barrier.MipLevelsCount - 1,
                                    " specified by the barrier is out of range. Texture '",
                                    TexDesc.Name, "' has only ", TexDesc.MipLevels, " mip level(s).");

        CHECK_STATE_TRANSITION_DESC(Barrier.FirstArraySlice < TexDesc.GetArraySize(), "first array slice (", Barrier.FirstArraySlice,
                                    ") specified by the barrier is out of range. Array size of texture '",
                                    TexDesc.Name, "' is ", TexDesc.GetArraySize());
        CHECK_STATE_TRANSITION_DESC(Barrier.ArraySliceCount == REMAINING_ARRAY_SLICES || Barrier.FirstArraySlice + Barrier.ArraySliceCount <= TexDesc.GetArraySize(),
                                    "array slice range ", Barrier.FirstArraySlice, "..", Barrier.FirstArraySlice + Barrier.ArraySliceCount - 1,
                                    " specified by the barrier is out of range. Array size of texture '",
                                    TexDesc.Name, "' is ", TexDesc.GetArraySize());

        RENDER_DEVICE_TYPE DeviceType = pDevice->GetDeviceInfo().Type;
        if (DeviceType != RENDER_DEVICE_TYPE_D3D12 && DeviceType != RENDER_DEVICE_TYPE_VULKAN)
        {
            CHECK_STATE_TRANSITION_DESC(Barrier.FirstMipLevel == 0 && (Barrier.MipLevelsCount == REMAINING_MIP_LEVELS || Barrier.MipLevelsCount == TexDesc.MipLevels),
                                        "failed to transition texture '", TexDesc.Name, "': only whole resources can be transitioned on this device.");
            CHECK_STATE_TRANSITION_DESC(Barrier.FirstArraySlice == 0 && (Barrier.ArraySliceCount == REMAINING_ARRAY_SLICES || Barrier.ArraySliceCount == TexDesc.GetArraySize()),
                                        "failed to transition texture '", TexDesc.Name, "': only whole resources can be transitioned on this device.");
        }
    }
    else if (RefCntAutoPtr<IBuffer> pBuffer{Barrier.pResource, IID_Buffer})
    {
        const BufferDesc& BuffDesc = pBuffer->GetDesc();
        ImmediateContextMask       = BuffDesc.ImmediateContextMask;
        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(Barrier.NewState, false), "invalid new state specified for buffer '", BuffDesc.Name, "'.");
        OldState = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pBuffer->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN, "the state of buffer '", BuffDesc.Name, "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(OldState, false), "invalid old state specified for buffer '", BuffDesc.Name, "'.");
    }
    else if (RefCntAutoPtr<IBottomLevelAS> pBottomLevelAS{Barrier.pResource, IID_BottomLevelAS})
    {
        const BottomLevelASDesc& BLASDesc = pBottomLevelAS->GetDesc();
        ImmediateContextMask              = BLASDesc.ImmediateContextMask;
        OldState                          = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pBottomLevelAS->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN, "the state of BLAS '", BLASDesc.Name, "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(Barrier.NewState == RESOURCE_STATE_BUILD_AS_READ || Barrier.NewState == RESOURCE_STATE_BUILD_AS_WRITE,
                                    "invalid new state specified for BLAS '", BLASDesc.Name, "'.");
        CHECK_STATE_TRANSITION_DESC(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE, "split barriers are not supported for BLAS.");
    }
    else if (RefCntAutoPtr<ITopLevelAS> pTopLevelAS{Barrier.pResource, IID_TopLevelAS})
    {
        const TopLevelASDesc& TLASDesc = pTopLevelAS->GetDesc();
        ImmediateContextMask           = TLASDesc.ImmediateContextMask;
        OldState                       = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pTopLevelAS->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN, "the state of TLAS '", TLASDesc.Name, "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(Barrier.NewState == RESOURCE_STATE_BUILD_AS_READ || Barrier.NewState == RESOURCE_STATE_BUILD_AS_WRITE || Barrier.NewState == RESOURCE_STATE_RAY_TRACING,
                                    "invalid new state specified for TLAS '", TLASDesc.Name, "'.");
        CHECK_STATE_TRANSITION_DESC(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE, "split barriers are not supported for TLAS.");
    }
    else
    {
        UNEXPECTED("unsupported resource type");
    }

    CHECK_STATE_TRANSITION_DESC((ImmediateContextMask & (Uint64{1} << Uint64{ExecutionCtxId})) != 0,
                                "resource was created with ImmediateContextMask 0x", std::hex, ImmediateContextMask, " and can not be used in device context '", CtxDesc.Name, "'.");

    if (OldState == RESOURCE_STATE_UNORDERED_ACCESS && Barrier.NewState == RESOURCE_STATE_UNORDERED_ACCESS)
    {
        CHECK_STATE_TRANSITION_DESC(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE,
                                    "for UAV barriers, transition type must be STATE_TRANSITION_TYPE_IMMEDIATE.");
    }

    switch (Barrier.TransitionType)
    {
        case STATE_TRANSITION_TYPE_IMMEDIATE:
            break;

        case STATE_TRANSITION_TYPE_BEGIN:
            CHECK_STATE_TRANSITION_DESC((Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) == 0, "resource state can't be updated in begin-split barrier.");
            break;

        case STATE_TRANSITION_TYPE_END:
            break;

        default:
            UNEXPECTED("Unexpected transition type");
    }

    VerifyResourceState(Barrier.OldState, CtxDesc.QueueType, "OldState");
    VerifyResourceState(Barrier.NewState, CtxDesc.QueueType, "NewState");


    return true;
}